

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O3

uint32_t event_track::get_meta_segment_bytes
                   (vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                    *in_emsg_list,uint64_t seg_start,uint64_t seg_end,uint32_t track_id,
                   uint32_t timescale,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *segment_bytes,
                   uint32_t seq_num,bool is_vtt)

{
  pointer *ppuVar1;
  int iVar2;
  int iVar3;
  pointer puVar4;
  iterator __position;
  size_type __n;
  size_type sVar5;
  uint64_t timestamp_tfdt;
  uint64_t next_tfdt;
  stringstream ot;
  uchar local_1d9;
  vector<event_track::EventSample,_std::allocator<event_track::EventSample>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8,_S_out|_S_in|_S_bin);
  local_1d8.super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  next_tfdt = (uint64_t)is_vtt;
  find_event_samples(in_emsg_list,&local_1d8,seg_start,seg_end,is_vtt);
  write_evt_samples_as_fmp4_fragment(&local_1d8,local_1a8,timestamp_tfdt,track_id,next_tfdt,seq_num)
  ;
  std::istream::seekg((long)local_1b8,_S_beg);
  __n = std::istream::tellg();
  std::istream::seekg((long)local_1b8,_S_beg);
  puVar4 = (segment_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((segment_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (segment_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(segment_bytes,__n);
  while( true ) {
    sVar5 = std::istream::tellg();
    if (sVar5 == __n) break;
    local_1d9 = std::istream::get();
    __position._M_current =
         (segment_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (segment_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (segment_bytes,__position,&local_1d9);
    }
    else {
      *__position._M_current = local_1d9;
      ppuVar1 = &(segment_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  iVar2 = *(int *)&(segment_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = *(int *)&(segment_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   )._M_impl.super__Vector_impl_data._M_start;
  std::vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>::~vector
            (&local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return iVar2 - iVar3;
}

Assistant:

uint32_t event_track::get_meta_segment_bytes(
	std::vector<event_track::DASHEventMessageBoxv1>& in_emsg_list,
	uint64_t seg_start,
	uint64_t seg_end,
	uint32_t track_id,
	uint32_t timescale,
	std::vector<uint8_t>& segment_bytes,
	uint32_t seq_num,
    bool is_vtt)
{
	std::stringstream ot(
		std::stringstream::out | \
		std::stringstream::in | \
		std::stringstream::binary\
	);

	std::vector<event_track::EventSample> samples_in_segment;

	find_event_samples(
		in_emsg_list,
		samples_in_segment,
		seg_start,
		seg_end,
		is_vtt
	);

	event_track::write_evt_samples_as_fmp4_fragment(
		samples_in_segment,
		ot,
		seg_start,
		track_id,
		seg_end,
		seq_num
	);

	ot.seekg(0, ot.end);
	uint64_t length = ot.tellg();
	ot.seekg(0, ot.beg);
	segment_bytes.clear();
	segment_bytes.reserve(length);

	char c;
	while (ot.tellg() != length)
	{
		c = ot.get();
		segment_bytes.push_back((uint8_t)c);
	}

	return (uint32_t)segment_bytes.size();
}